

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMU_CAPABILITIES_Unmarshal
                 (TPMU_CAPABILITIES *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  TPM_RC TVar1;
  
  switch(selector) {
  case 0:
    TVar1 = TPML_ALG_PROPERTY_Unmarshal(&target->algorithms,buffer,size);
    return TVar1;
  case 1:
    TVar1 = TPML_HANDLE_Unmarshal(&target->handles,buffer,size);
    return TVar1;
  case 2:
    TVar1 = TPML_CCA_Unmarshal(&target->command,buffer,size);
    return TVar1;
  case 3:
  case 4:
    TVar1 = TPML_CC_Unmarshal(&target->ppCommands,buffer,size);
    return TVar1;
  case 5:
    TVar1 = TPML_PCR_SELECTION_Unmarshal(&target->assignedPCR,buffer,size);
    return TVar1;
  case 6:
    TVar1 = TPML_TAGGED_TPM_PROPERTY_Unmarshal(&target->tpmProperties,buffer,size);
    return TVar1;
  case 7:
    TVar1 = TPML_TAGGED_PCR_PROPERTY_Unmarshal(&target->pcrProperties,buffer,size);
    return TVar1;
  case 8:
    TVar1 = TPML_ECC_CURVE_Unmarshal(&target->eccCurves,buffer,size);
    return TVar1;
  case 9:
    TVar1 = TPML_TAGGED_POLICY_Unmarshal(&target->authPolicies,buffer,size);
    return TVar1;
  default:
    return 0x98;
  }
}

Assistant:

TPM_RC
TPMU_CAPABILITIES_Unmarshal(TPMU_CAPABILITIES *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
        case TPM_CAP_ALGS:
            return TPML_ALG_PROPERTY_Unmarshal((TPML_ALG_PROPERTY *)&(target->algorithms), buffer, size);
        case TPM_CAP_HANDLES:
            return TPML_HANDLE_Unmarshal((TPML_HANDLE *)&(target->handles), buffer, size);
        case TPM_CAP_COMMANDS:
            return TPML_CCA_Unmarshal((TPML_CCA *)&(target->command), buffer, size);
        case TPM_CAP_PP_COMMANDS:
            return TPML_CC_Unmarshal((TPML_CC *)&(target->ppCommands), buffer, size);
        case TPM_CAP_AUDIT_COMMANDS:
            return TPML_CC_Unmarshal((TPML_CC *)&(target->auditCommands), buffer, size);
        case TPM_CAP_PCRS:
            return TPML_PCR_SELECTION_Unmarshal((TPML_PCR_SELECTION *)&(target->assignedPCR), buffer, size);
        case TPM_CAP_TPM_PROPERTIES:
            return TPML_TAGGED_TPM_PROPERTY_Unmarshal((TPML_TAGGED_TPM_PROPERTY *)&(target->tpmProperties), buffer, size);
        case TPM_CAP_PCR_PROPERTIES:
            return TPML_TAGGED_PCR_PROPERTY_Unmarshal((TPML_TAGGED_PCR_PROPERTY *)&(target->pcrProperties), buffer, size);
#if         ALG_ECC
        case TPM_CAP_ECC_CURVES:
            return TPML_ECC_CURVE_Unmarshal((TPML_ECC_CURVE *)&(target->eccCurves), buffer, size);
#endif // ALG_ECC
        case TPM_CAP_AUTH_POLICIES:
            return TPML_TAGGED_POLICY_Unmarshal((TPML_TAGGED_POLICY *)&(target->authPolicies), buffer, size);
    }
    return TPM_RC_SELECTOR;
}